

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsComponentGetPart(FmsComponent comp,FmsInt part_id,FmsEntityType type,FmsDomain *domain,
                       FmsIntType *ent_id_type,void **ents,FmsOrientation **ent_orients,
                       FmsInt *num_ents)

{
  _FmsPart_private *p_Var1;
  _FmsPart_private *part;
  void **ents_local;
  FmsIntType *ent_id_type_local;
  FmsDomain *domain_local;
  FmsEntityType type_local;
  FmsInt part_id_local;
  FmsComponent comp_local;
  int local_4;
  
  if (comp == (FmsComponent)0x0) {
    local_4 = 1;
  }
  else if (part_id < comp->num_parts) {
    if (type < FMS_NUM_ENTITY_TYPES) {
      p_Var1 = comp->parts + part_id;
      if (domain != (FmsDomain *)0x0) {
        *domain = p_Var1->domain;
      }
      if (ent_id_type != (FmsIntType *)0x0) {
        *ent_id_type = p_Var1->entities_ids_type[type];
      }
      if (ents != (void **)0x0) {
        *ents = p_Var1->entities_ids[type];
      }
      if (ent_orients != (FmsOrientation **)0x0) {
        *ent_orients = p_Var1->orientations[type];
      }
      if (num_ents != (FmsInt *)0x0) {
        *num_ents = p_Var1->num_entities[type];
      }
      local_4 = 0;
    }
    else {
      local_4 = 3;
    }
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int FmsComponentGetPart(FmsComponent comp, FmsInt part_id, FmsEntityType type,
                        FmsDomain *domain, FmsIntType *ent_id_type,
                        const void **ents, const FmsOrientation **ent_orients,
                        FmsInt *num_ents) {
  if (!comp) { E_RETURN(1); }
  if (part_id >= comp->num_parts) { E_RETURN(2); }
  if (type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(3); }
  // if (FmsEntityDim[type] != comp->dim) { E_RETURN(4); }
  struct _FmsPart_private *part = &comp->parts[part_id];
  if (domain) { *domain = part->domain; }
  if (ent_id_type) { *ent_id_type = part->entities_ids_type[type]; }
  if (ents) { *ents = part->entities_ids[type]; }
  if (ent_orients) { *ent_orients = part->orientations[type]; }
  if (num_ents) { *num_ents = part->num_entities[type]; }
  return 0;
}